

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

GMappedFile * p2sc_map_file(char *name)

{
  GMappedFile *pGVar1;
  undefined8 in_RDI;
  GMappedFile *map;
  GError *err;
  long local_10;
  undefined8 local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  pGVar1 = (GMappedFile *)g_mapped_file_new(in_RDI,0,&local_10);
  if (pGVar1 != (GMappedFile *)0x0) {
    return pGVar1;
  }
  if ((local_10 != 0) && (*(long *)(local_10 + 8) != 0)) {
    _p2sc_msg("p2sc_map_file",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x17e,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"%s",
              *(undefined8 *)(local_10 + 8));
    exit(1);
  }
  _p2sc_msg("p2sc_map_file",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,0x181,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
            "%s: file reading failed: unknown reason",local_8);
  exit(1);
}

Assistant:

GMappedFile *p2sc_map_file(const char *name) {
    GError *err = NULL;
    GMappedFile *map = g_mapped_file_new(name, FALSE, &err);

    if (!map) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s", err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: file reading failed: unknown reason", name);
    }

    return map;
}